

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_api.c
# Opt level: O0

MPP_RET av1d_init(void *ctx,ParserCfg *init)

{
  void *data;
  Av1CodecContext *av1_ctx;
  RK_S32 size;
  RK_U8 *buf;
  MPP_RET ret;
  ParserCfg *init_local;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) || (init == (ParserCfg *)0x0)) {
    _mpp_log_l(2,"av1d_api","av1d init fail",(char *)0x0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *(undefined4 *)((long)ctx + 0x10) = 0x10011;
    *(undefined4 *)((long)ctx + 0xcfc) = 0x10011;
    buf._4_4_ = av1d_parser_init((Av1CodecContext *)ctx,init);
    if ((buf._4_4_ == MPP_OK) &&
       (buf._4_4_ = av1d_split_init((Av1CodecContext *)ctx), buf._4_4_ == MPP_OK)) {
      data = mpp_osal_malloc("av1d_init",0x80000);
      if (data == (void *)0x0) {
        _mpp_log_l(2,"av1d_api","av1d init malloc stream buffer fail",(char *)0x0);
        buf._4_4_ = MPP_ERR_NOMEM;
      }
      else {
        buf._4_4_ = mpp_packet_init((MppPacket *)((long)ctx + 0x38),data,0x80000);
        if (buf._4_4_ == MPP_OK) {
          *(void **)((long)ctx + 0xce8) = data;
          *(undefined4 *)((long)ctx + 0xcf0) = 0x80000;
          mpp_packet_set_size(*(MppPacket *)((long)ctx + 0x38),0x80000);
          mpp_packet_set_length(*(MppPacket *)((long)ctx + 0x38),0);
          return MPP_OK;
        }
      }
    }
    av1d_deinit(ctx);
    ctx_local._4_4_ = buf._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET av1d_init(void *ctx, ParserCfg *init)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf = NULL;
    RK_S32 size = SZ_512K;
    Av1CodecContext *av1_ctx = (Av1CodecContext *)ctx;

    if (!av1_ctx || !init) {
        mpp_err("av1d init fail");
        return MPP_ERR_NULL_PTR;
    }

    av1_ctx->pix_fmt = MPP_FMT_BUTT;
    av1_ctx->usr_set_fmt = MPP_FMT_BUTT;

    if ((ret = av1d_parser_init(av1_ctx, init)) != MPP_OK)
        goto _err_exit;

    if ((ret = av1d_split_init(av1_ctx)) != MPP_OK)
        goto _err_exit;

    buf = mpp_malloc(RK_U8, size);
    if (!buf) {
        mpp_err("av1d init malloc stream buffer fail");
        ret = MPP_ERR_NOMEM;
        goto _err_exit;
    }

    if ((ret = mpp_packet_init(&av1_ctx->pkt, (void *)buf, size)) != MPP_OK)
        goto _err_exit;

    av1_ctx->stream = buf;
    av1_ctx->stream_size = size;
    mpp_packet_set_size(av1_ctx->pkt, size);
    mpp_packet_set_length(av1_ctx->pkt, 0);

    return ret;

_err_exit:
    av1d_deinit(av1_ctx);
    return ret;
}